

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbufstream.h
# Opt level: O1

ktx_error_code_e
StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::getpos
          (ktxStream *str,ktx_off_t *offset)

{
  long *plVar1;
  ktx_off_t kVar2;
  ostream *poVar3;
  
  plVar1 = *(long **)((str->data).file + 8);
  kVar2 = (**(code **)(*plVar1 + 0x20))(plVar1,0,1,*(undefined4 *)((str->data).file + 0x10));
  *offset = kVar2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)cnull,"\tgetpos: ",9);
  poVar3 = std::ostream::_M_insert<long>(0x13c830);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return KTX_SUCCESS;
}

Assistant:

static KTX_error_code getpos(ktxStream* str, ktx_off_t *offset)
    {
        auto self = parent(str);
        *offset = ktx_off_t(self->_streambuf->pubseekoff(0, std::ios::cur, self->_seek_mode));
        logstream << "\tgetpos: " << *offset << std::endl;
        return KTX_SUCCESS;
    }